

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.h
# Opt level: O0

void hydro_x25519_sc_montmul(hydro_x25519_limb_t *out,hydro_x25519_limb_t *a,hydro_x25519_limb_t *b)

{
  ulong uVar1;
  hydro_x25519_limb_t hVar2;
  long in_RDX;
  ulong uVar3;
  long in_RSI;
  long in_RDI;
  hydro_x25519_limb_t carry;
  hydro_x25519_limb_t need_add;
  hydro_x25519_sdlimb_t scarry;
  hydro_x25519_limb_t acc;
  hydro_x25519_limb_t mand2;
  hydro_x25519_limb_t mand;
  hydro_x25519_limb_t carry2;
  hydro_x25519_limb_t carry_1;
  int j;
  int i;
  hydro_x25519_limb_t hic;
  hydro_x25519_limb_t local_78;
  hydro_x25519_limb_t local_70;
  ulong local_68;
  long local_60;
  hydro_x25519_limb_t local_50;
  hydro_x25519_limb_t local_48;
  hydro_x25519_limb_t local_40;
  hydro_x25519_limb_t local_38;
  hydro_x25519_limb_t local_30;
  int local_28;
  int local_24;
  hydro_x25519_limb_t local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    local_30 = 0;
    local_38 = 0;
    local_40 = *(hydro_x25519_limb_t *)(local_10 + (long)local_24 * 8);
    local_48 = 0xd2b51da312547e1b;
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      local_50 = *(hydro_x25519_limb_t *)(local_8 + (long)local_28 * 8);
      local_50 = hydro_x25519_umaal(&local_30,local_50,local_40,
                                    *(hydro_x25519_limb_t *)(local_18 + (long)local_28 * 8));
      if (local_28 == 0) {
        local_48 = local_50 * local_48;
      }
      local_50 = hydro_x25519_umaal(&local_38,local_50,local_48,hydro_x25519_sc_p[local_28]);
      if (0 < local_28) {
        *(hydro_x25519_limb_t *)(local_8 + (long)(local_28 + -1) * 8) = local_50;
      }
    }
    hVar2 = hydro_x25519_adc(&local_20,local_30,local_38);
    *(hydro_x25519_limb_t *)(local_8 + 0x18) = hVar2;
  }
  local_60 = 0;
  local_68 = 0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    uVar1 = *(ulong *)(local_8 + (long)local_24 * 8);
    uVar3 = local_68 + uVar1;
    local_68 = (local_60 + (ulong)CARRY8(local_68,uVar1)) -
               (ulong)(uVar3 < hydro_x25519_sc_p[local_24]);
    *(ulong *)(local_8 + (long)local_24 * 8) = uVar3 - hydro_x25519_sc_p[local_24];
    local_60 = (long)local_68 >> 0x3f;
  }
  local_70 = -(local_68 + local_20);
  local_78 = 0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    hVar2 = hydro_x25519_umaal(&local_78,*(hydro_x25519_limb_t *)(local_8 + (long)local_24 * 8),
                               local_70,hydro_x25519_sc_p[local_24]);
    *(hydro_x25519_limb_t *)(local_8 + (long)local_24 * 8) = hVar2;
  }
  return;
}

Assistant:

static void
hydro_x25519_sc_montmul(hydro_x25519_scalar_t out, const hydro_x25519_scalar_t a,
                        const hydro_x25519_scalar_t b)
{
    hydro_x25519_limb_t hic = 0;
    int                 i, j;

    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        hydro_x25519_limb_t carry = 0, carry2 = 0, mand = a[i],
                            mand2 = hydro_x25519_MONTGOMERY_FACTOR;

        for (j = 0; j < hydro_x25519_NLIMBS; j++) {
            hydro_x25519_limb_t acc = out[j];

            acc = hydro_x25519_umaal(&carry, acc, mand, b[j]);
            if (j == 0) {
                mand2 *= acc;
            }
            acc = hydro_x25519_umaal(&carry2, acc, mand2, hydro_x25519_sc_p[j]);
            if (j > 0) {
                out[j - 1] = acc;
            }
        }

        /* Add two carry registers and high carry */
        out[hydro_x25519_NLIMBS - 1] = hydro_x25519_adc(&hic, carry, carry2);
    }

    /* Reduce */
    hydro_x25519_sdlimb_t scarry = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        out[i] = (hydro_x25519_limb_t) (scarry = scarry + out[i] - hydro_x25519_sc_p[i]);
        scarry >>= hydro_x25519_WBITS;
    }
    hydro_x25519_limb_t need_add = (hydro_x25519_limb_t) - (scarry + hic);

    hydro_x25519_limb_t carry = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        out[i] = hydro_x25519_umaal(&carry, out[i], need_add, hydro_x25519_sc_p[i]);
    }
}